

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int string_buffer_putc8(StringBuffer *s,uint32_t c)

{
  int iVar1;
  
  if ((s->size <= s->len) && (iVar1 = string_buffer_realloc(s,s->len + 1,c), iVar1 != 0)) {
    return -1;
  }
  iVar1 = s->len;
  s->len = iVar1 + 1;
  if (s->is_wide_char == 0) {
    *(char *)((long)&s->str[1].header.ref_count + (long)iVar1) = (char)c;
  }
  else {
    *(short *)((long)&s->str[1].header.ref_count + (long)iVar1 * 2) = (short)c;
  }
  return 0;
}

Assistant:

static int string_buffer_putc8(StringBuffer *s, uint32_t c)
{
    if (unlikely(s->len >= s->size)) {
        if (string_buffer_realloc(s, s->len + 1, c))
            return -1;
    }
    if (s->is_wide_char) {
        s->str->u.str16[s->len++] = c;
    } else {
        s->str->u.str8[s->len++] = c;
    }
    return 0;
}